

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformRotateKHR
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  spv_result_t id;
  int32_t iVar6;
  Instruction *pIVar7;
  long lVar8;
  char *pcVar9;
  uint64_t cluster_size;
  ulong local_200;
  DiagnosticStream local_1f8;
  
  uVar5 = (inst->inst_).type_id;
  bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,uVar5);
  if (((!bVar1) && (bVar1 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar5), !bVar1)) &&
     (bVar1 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar5), !bVar1)) {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = 
    "Expected Result Type to be a scalar or vector of floating-point, integer or boolean type.";
    lVar8 = 0x59;
LAB_0019f089:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar9,lVar8);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
    return local_1f8.error_;
  }
  uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,3);
  uVar4 = ValidationState_t::GetTypeId(_,uVar3);
  if (uVar4 != uVar5) {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "Result Type must be the same as the type of Value.";
    lVar8 = 0x32;
    goto LAB_0019f089;
  }
  uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  uVar5 = ValidationState_t::GetTypeId(_,uVar3);
  bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,uVar5);
  if (!bVar1) {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "Delta must be a scalar of integer type, whose Signedness operand is 0.";
    lVar8 = 0x46;
    goto LAB_0019f089;
  }
  if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start) < 0x19) {
    return SPV_SUCCESS;
  }
  id = Instruction::GetOperandAs<unsigned_int>(inst,5);
  pIVar7 = ValidationState_t::FindDef(_,id);
  if ((pIVar7 == (Instruction *)0x0) ||
     (bVar1 = ValidationState_t::IsUnsignedIntScalarType(_,(pIVar7->inst_).type_id), !bVar1)) {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = "ClusterSize must be a scalar of integer type, whose Signedness operand is 0.";
    lVar8 = 0x4c;
  }
  else {
    iVar6 = spvOpcodeIsConstant((uint)(pIVar7->inst_).opcode);
    if (iVar6 == 0) {
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "ClusterSize must come from a constant instruction.";
      lVar8 = 0x32;
    }
    else {
      bVar2 = ValidationState_t::EvalConstantValUint64(_,id,&local_200);
      bVar1 = true;
      if ((!bVar2) || (local_200 - 1 < (local_200 ^ local_200 - 1))) goto LAB_0019f0ed;
      ValidationState_t::diag(&local_1f8,_,SPV_WARNING,inst);
      pcVar9 = "Behavior is undefined unless ClusterSize is at least 1 and a power of 2.";
      lVar8 = 0x48;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar9,lVar8);
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  bVar1 = false;
  id = local_1f8.error_;
LAB_0019f0ed:
  if (bVar1) {
    return SPV_SUCCESS;
  }
  return id;
}

Assistant:

spv_result_t ValidateGroupNonUniformRotateKHR(ValidationState_t& _,
                                              const Instruction* inst) {
  // Scope is already checked by ValidateExecutionScope() above.
  const uint32_t result_type = inst->type_id();
  if (!_.IsIntScalarOrVectorType(result_type) &&
      !_.IsFloatScalarOrVectorType(result_type) &&
      !_.IsBoolScalarOrVectorType(result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be a scalar or vector of "
              "floating-point, integer or boolean type.";
  }

  const uint32_t value_type = _.GetTypeId(inst->GetOperandAs<uint32_t>(3));
  if (value_type != result_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result Type must be the same as the type of Value.";
  }

  const uint32_t delta_type = _.GetTypeId(inst->GetOperandAs<uint32_t>(4));
  if (!_.IsUnsignedIntScalarType(delta_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Delta must be a scalar of integer type, whose Signedness "
              "operand is 0.";
  }

  if (inst->words().size() > 6) {
    const uint32_t cluster_size_op_id = inst->GetOperandAs<uint32_t>(5);
    const Instruction* cluster_size_inst = _.FindDef(cluster_size_op_id);
    if (!cluster_size_inst ||
        !_.IsUnsignedIntScalarType(cluster_size_inst->type_id())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ClusterSize must be a scalar of integer type, whose "
                "Signedness operand is 0.";
    }

    if (!spvOpcodeIsConstant(cluster_size_inst->opcode())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "ClusterSize must come from a constant instruction.";
    }

    uint64_t cluster_size;
    const bool valid_const =
        _.EvalConstantValUint64(cluster_size_op_id, &cluster_size);
    if (valid_const &&
        ((cluster_size == 0) || ((cluster_size & (cluster_size - 1)) != 0))) {
      return _.diag(SPV_WARNING, inst)
             << "Behavior is undefined unless ClusterSize is at least 1 and a "
                "power of 2.";
    }

    // TODO(kpet) Warn about undefined behavior when ClusterSize is greater than
    // the declared SubGroupSize
  }

  return SPV_SUCCESS;
}